

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

Info * __thiscall V2Transport::GetInfo(Info *__return_storage_ptr__,V2Transport *this)

{
  RecvState RVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock55;
  base_blob<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock55,&this->m_recv_mutex,"m_recv_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x611,false);
  RVar1 = this->m_recv_state;
  if (RVar1 == V1) {
    __return_storage_ptr__->transport_type = V1;
    (__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  else {
    (__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
    if (RVar1 < APP) {
      __return_storage_ptr__->transport_type = DETECTING;
    }
    else {
      __return_storage_ptr__->transport_type = V2;
      vch.m_size = 0x20;
      vch.m_data = (this->m_cipher).m_session_id._M_elems;
      base_blob<256U>::base_blob(&local_38,vch);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x10) =
           local_38.m_data._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x18) =
           local_38.m_data._M_elems._24_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_payload = local_38.m_data._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_payload + 8) =
           local_38.m_data._M_elems._8_8_;
      (__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = true;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Transport::Info V2Transport::GetInfo() const noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.GetInfo();

    Transport::Info info;

    // Do not report v2 and session ID until the version packet has been received
    // and verified (confirming that the other side very likely has the same keys as us).
    if (m_recv_state != RecvState::KEY_MAYBE_V1 && m_recv_state != RecvState::KEY &&
        m_recv_state != RecvState::GARB_GARBTERM && m_recv_state != RecvState::VERSION) {
        info.transport_type = TransportProtocolType::V2;
        info.session_id = uint256(MakeUCharSpan(m_cipher.GetSessionID()));
    } else {
        info.transport_type = TransportProtocolType::DETECTING;
    }

    return info;
}